

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O2

pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> __thiscall
HandleInfo<XrTriangleMeshFB_T_*>::getWithInstanceInfo
          (HandleInfo<XrTriangleMeshFB_T_*> *this,XrTriangleMeshFB_T *handle)

{
  GenValidUsageXrHandleInfo *pGVar1;
  GenValidUsageXrInstanceInfo *pGVar2;
  iterator iVar3;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar4;
  UniqueLock lock;
  allocator local_49;
  unique_lock<std::mutex> local_48;
  XrTriangleMeshFB_T *local_38;
  string local_30;
  
  local_38 = handle;
  if (handle == (XrTriangleMeshFB_T *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_30,"Null handle passed to HandleInfoBase::getWithInstanceInfo()",
               (allocator *)&local_48);
    reportInternalError(&local_30);
  }
  std::unique_lock<std::mutex>::unique_lock
            (&local_48,
             &(this->super_HandleInfoBase<XrTriangleMeshFB_T_*,_GenValidUsageXrHandleInfo>).
              dispatch_mutex_);
  iVar3 = std::
          _Hashtable<XrTriangleMeshFB_T_*,_std::pair<XrTriangleMeshFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrTriangleMeshFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrTriangleMeshFB_T_*>,_std::hash<XrTriangleMeshFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<XrTriangleMeshFB_T_*,_std::pair<XrTriangleMeshFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrTriangleMeshFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrTriangleMeshFB_T_*>,_std::hash<XrTriangleMeshFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_38);
  if (iVar3.
      super__Node_iterator_base<std::pair<XrTriangleMeshFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    pGVar1 = *(GenValidUsageXrHandleInfo **)
              ((long)iVar3.
                     super__Node_iterator_base<std::pair<XrTriangleMeshFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
                     ._M_cur + 0x10);
    pGVar2 = pGVar1->instance_info;
    std::unique_lock<std::mutex>::~unique_lock(&local_48);
    pVar4.second = pGVar2;
    pVar4.first = pGVar1;
    return pVar4;
  }
  std::__cxx11::string::string
            ((string *)&local_30,
             "Handle passed to HandleInfoBase::getWithInstanceInfo() not inserted",&local_49);
  reportInternalError(&local_30);
}

Assistant:

inline std::pair<GenValidUsageXrHandleInfo *, GenValidUsageXrInstanceInfo *> HandleInfo<HandleType>::getWithInstanceInfo(
    HandleType handle) {
    if (handle == XR_NULL_HANDLE) {
        reportInternalError("Null handle passed to HandleInfoBase::getWithInstanceInfo()");
    }
    // Try to find the handle in the appropriate map
    UniqueLock lock(this->dispatch_mutex_);
    auto entry_returned = this->info_map_.find(handle);
    if (entry_returned == this->info_map_.end()) {
        reportInternalError("Handle passed to HandleInfoBase::getWithInstanceInfo() not inserted");
    }
    GenValidUsageXrHandleInfo *info = entry_returned->second.get();
    GenValidUsageXrInstanceInfo *instance_info = info->instance_info;
    return {info, instance_info};
}